

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O2

maybe<pstore::command_line::option_*,_void> *
pstore::command_line::details::find_handler
          (maybe<pstore::command_line::option_*,_void> *__return_storage_ptr__,string *name)

{
  __type_conflict1 _Var1;
  _List_node_base *p_Var2;
  string *__lhs;
  _List_node_base *p_Var3;
  
  p_Var2 = (_List_node_base *)option::all_abi_cxx11_();
  p_Var3 = p_Var2;
  do {
    p_Var3 = (((_List_base<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>
                *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var3 == p_Var2) {
      *(undefined8 *)__return_storage_ptr__ = 0;
      __return_storage_ptr__->storage_ = (type)0x0;
      return __return_storage_ptr__;
    }
    __lhs = option::name_abi_cxx11_((option *)p_Var3[1]._M_next);
    _Var1 = std::operator==(__lhs,name);
  } while (!_Var1);
  __return_storage_ptr__->valid_ = true;
  __return_storage_ptr__->storage_ = (type)p_Var3[1]._M_next;
  return __return_storage_ptr__;
}

Assistant:

maybe<option *> find_handler (std::string const & name) {
                    auto const & all_options = option::all ();
                    auto const end = std::end (all_options);
                    auto const it =
                        std::find_if (std::begin (all_options), end, [&name] (option * const opt) {
                            return opt->name () == name;
                        });
                    return it != end ? just (*it) : nothing<option *> ();
                }